

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O2

bool __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::MayIntersect
          (S2ShapeIndexRegion<S2ShapeIndex> *this,S2Cell *target)

{
  Iterator *it;
  bool bVar1;
  bool bVar2;
  CellRelation CVar3;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  const_reference clipped;
  int s;
  uint n;
  S2CellId local_50;
  S2Point local_48;
  
  CVar3 = S2ShapeIndex::IteratorBase::LocateImpl<S2ShapeIndex::Iterator>
                    ((S2CellId)(target->id_).id_,this->iter_);
  if (CVar3 == DISJOINT) {
    bVar1 = false;
  }
  else if (CVar3 == SUBDIVIDED) {
    bVar1 = true;
  }
  else {
    local_50.id_ = (((this->iter_->iter_)._M_t.
                     super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                     .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_)
                   .id_;
    bVar1 = S2CellId::contains(&local_50,(S2CellId)(target->id_).id_);
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index_region.h"
                 ,0x128,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)local_48.c_[1],"Check failed: iter_.id().contains(target.id()) ");
      abort();
    }
    bVar1 = true;
    if ((((this->iter_->iter_)._M_t.
          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).id_ !=
        (target->id_).id_) {
      this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                S2ShapeIndex::Iterator::cell(this->iter_);
      n = 0;
      do {
        bVar1 = n < (*(uint *)this_00 & 0xffffff);
        if (!bVar1) {
          return bVar1;
        }
        clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                  operator[](this_00,n);
        bVar2 = AnyEdgeIntersects(this,clipped,target);
        if (bVar2) {
          return bVar1;
        }
        it = this->iter_;
        S2Cell::GetCenter(&local_48,target);
        bVar2 = S2ContainsPointQuery<S2ShapeIndex>::ShapeContains
                          (&this->contains_query_,it,clipped,&local_48);
        n = n + 1;
      } while (!bVar2);
    }
  }
  return bVar1;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::MayIntersect(const S2Cell& target) const {
  S2ShapeIndex::CellRelation relation = iter_.Locate(target.id());

  // If "target" does not overlap any index cell, there is no intersection.
  if (relation == S2ShapeIndex::DISJOINT) return false;

  // If "target" is subdivided into one or more index cells, then there is an
  // intersection to within the S2ShapeIndex error bound.
  if (relation == S2ShapeIndex::SUBDIVIDED) return true;

  // Otherwise, the iterator points to an index cell containing "target".
  //
  // If "target" is an index cell itself, there is an intersection because index
  // cells are created only if they have at least one edge or they are
  // entirely contained by the loop.
  S2_DCHECK(iter_.id().contains(target.id()));
  if (iter_.id() == target.id()) return true;

  // Test whether any shape intersects the target cell or contains its center.
  const S2ShapeIndexCell& cell = iter_.cell();
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    if (AnyEdgeIntersects(clipped, target)) return true;
    if (contains_query_.ShapeContains(iter_, clipped, target.GetCenter())) {
      return true;
    }
  }
  return false;
}